

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O2

int mac_method_hmac_sha2_512_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  EVP_MAC_CTX *ctx;
  uchar seqno_buf [4];
  
  _libssh2_htonu32(seqno_buf,seqno);
  iVar1 = _libssh2_hmac_ctx_init(&ctx);
  if (iVar1 != 0) {
    iVar1 = _libssh2_hmac_sha512_init(&ctx,*abstract,0x40);
    if ((iVar1 == 0) || (iVar1 = _libssh2_hmac_update(&ctx,seqno_buf,4), iVar1 == 0)) {
      bVar3 = false;
    }
    else {
      iVar1 = _libssh2_hmac_update(&ctx,packet,packet_len);
      bVar3 = iVar1 != 0;
    }
    if ((addtl != (uchar *)0x0 & bVar3 & addtl_len != 0) == 1) {
      uVar2 = _libssh2_hmac_update(&ctx,addtl,addtl_len);
    }
    else {
      uVar2 = (uint)bVar3;
    }
    if (uVar2 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = _libssh2_hmac_final(&ctx,buf);
      uVar2 = (uint)(iVar1 == 0);
    }
    _libssh2_hmac_cleanup(&ctx);
    return uVar2;
  }
  return 1;
}

Assistant:

static int
mac_method_hmac_sha2_512_hash(LIBSSH2_SESSION * session,
                              unsigned char *buf, uint32_t seqno,
                              const unsigned char *packet,
                              size_t packet_len,
                              const unsigned char *addtl,
                              size_t addtl_len, void **abstract)
{
    libssh2_hmac_ctx ctx;
    unsigned char seqno_buf[4];
    int res;
    (void)session;

    _libssh2_htonu32(seqno_buf, seqno);

    if(!_libssh2_hmac_ctx_init(&ctx))
        return 1;
    res = _libssh2_hmac_sha512_init(&ctx, *abstract, 64) &&
          _libssh2_hmac_update(&ctx, seqno_buf, 4) &&
          _libssh2_hmac_update(&ctx, packet, packet_len);
    if(res && addtl && addtl_len)
        res = _libssh2_hmac_update(&ctx, addtl, addtl_len);
    if(res)
        res = _libssh2_hmac_final(&ctx, buf);
    _libssh2_hmac_cleanup(&ctx);

    return !res;
}